

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O0

int HTS_fgetc(HTS_File *fp)

{
  long *plVar1;
  long lVar2;
  char *in_RDI;
  HTS_Data *d;
  uint local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 0xffffffff;
  }
  else if (*in_RDI == '\0') {
    local_4 = fgetc(*(FILE **)(in_RDI + 8));
  }
  else if (*in_RDI == '\x01') {
    plVar1 = *(long **)(in_RDI + 8);
    if ((ulong)plVar1[2] < (ulong)plVar1[1]) {
      lVar2 = plVar1[2];
      plVar1[2] = lVar2 + 1;
      local_4 = (uint)*(byte *)(*plVar1 + lVar2);
    }
    else {
      local_4 = 0xffffffff;
    }
  }
  else {
    HTS_error(0,"HTS_fgetc: Unknown file type.\n");
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

int HTS_fgetc(HTS_File * fp)
{
   if (fp == NULL) {
      return EOF;
   } else if (fp->type == HTS_FILE) {
      return fgetc((FILE *) fp->pointer);
   } else if (fp->type == HTS_DATA) {
      HTS_Data *d = (HTS_Data *) fp->pointer;
      if (d->size <= d->index)
         return EOF;
      return (int) d->data[d->index++];
   }
   HTS_error(0, "HTS_fgetc: Unknown file type.\n");
   return EOF;
}